

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.hpp
# Opt level: O2

unique_ptr<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>_>
 __thiscall
HawkTracer::parser::
make_unique<HawkTracer::parser::EventKlassField,char_const(&)[5],char_const(&)[9],HawkTracer::parser::FieldTypeId>
          (parser *this,char (*args) [5],char (*args_1) [9],FieldTypeId *args_2)

{
  EventKlassField *this_00;
  allocator local_7a;
  allocator local_79;
  shared_ptr<const_HawkTracer::parser::EventKlass> local_78;
  string local_68;
  string local_48;
  
  this_00 = (EventKlassField *)operator_new(0x58);
  std::__cxx11::string::string((string *)&local_48,*args,&local_79);
  std::__cxx11::string::string((string *)&local_68,*args_1,&local_7a);
  local_78.super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  local_78.super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  EventKlassField::EventKlassField(this_00,&local_48,&local_68,*args_2,&local_78);
  *(EventKlassField **)this = this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.
              super___shared_ptr<const_HawkTracer::parser::EventKlass,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  return (__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
          )(__uniq_ptr_data<HawkTracer::parser::EventKlassField,_std::default_delete<HawkTracer::parser::EventKlassField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
{
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}